

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_166bcf::root_dir_start(anon_unknown_dwarf_166bcf *this,StringRef str,Style style)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  Style SVar4;
  char *__s;
  size_type sVar5;
  Style style_00;
  StringRef local_60;
  undefined1 auStack_48 [4];
  Style style_local;
  StringRef str_local;
  
  str_local.Data = str.Data;
  style_00 = (Style)str.Length;
  _auStack_48 = this;
  SVar4 = real_style(style_00);
  if (((SVar4 == windows) && ((char *)0x2 < str_local.Data)) &&
     (cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_48,1), cVar1 == ':')) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_48,2);
    bVar2 = llvm::sys::path::is_separator(cVar1,style_00);
    if (bVar2) {
      return 2;
    }
  }
  if ((char *)0x3 < str_local.Data) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_48,0);
    bVar2 = llvm::sys::path::is_separator(cVar1,style_00);
    if (bVar2) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_48,0);
      cVar3 = llvm::StringRef::operator[]((StringRef *)auStack_48,1);
      if (cVar1 == cVar3) {
        cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_48,2);
        bVar2 = llvm::sys::path::is_separator(cVar1,style_00);
        if (!bVar2) {
          __s = separators(style_00);
          local_60.Data = __s;
          if (__s != (char *)0x0) {
            strlen(__s);
          }
          sVar5 = llvm::StringRef::find_first_of((StringRef *)auStack_48,local_60,2);
          return sVar5;
        }
      }
    }
  }
  if (str_local.Data != (char *)0x0) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_48,0);
    bVar2 = llvm::sys::path::is_separator(cVar1,style_00);
    if (bVar2) {
      return 0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t root_dir_start(StringRef str, Style style) {
    // case "c:/"
    if (real_style(style) == Style::windows) {
      if (str.size() > 2 && str[1] == ':' && is_separator(str[2], style))
        return 2;
    }

    // case "//net"
    if (str.size() > 3 && is_separator(str[0], style) && str[0] == str[1] &&
        !is_separator(str[2], style)) {
      return str.find_first_of(separators(style), 2);
    }

    // case "/"
    if (str.size() > 0 && is_separator(str[0], style))
      return 0;

    return StringRef::npos;
  }